

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> * __thiscall
duckdb::RowGroup::GetColumns(RowGroup *this)

{
  idx_t c;
  ulong c_00;
  
  for (c_00 = 0;
      c_00 < (ulong)((long)(this->columns).
                           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                           .
                           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->columns).
                           super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                           .
                           super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4); c_00 = c_00 + 1) {
    GetColumn(this,c_00);
  }
  return &this->columns;
}

Assistant:

vector<shared_ptr<ColumnData>> &RowGroup::GetColumns() {
	// ensure all columns are loaded
	for (idx_t c = 0; c < GetColumnCount(); c++) {
		GetColumn(c);
	}
	return columns;
}